

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O3

void __thiscall
amrex::AmrLevel::UpdateDistributionMaps(AmrLevel *this,DistributionMapping *update_dmap)

{
  element_type *peVar1;
  element_type *peVar2;
  long *plVar3;
  pointer pSVar4;
  long lVar5;
  long lVar6;
  pointer pSVar7;
  long lVar8;
  long lVar9;
  
  peVar1 = (update_dmap->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar8 = (long)*(pointer *)
                 ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
          *(long *)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl;
  peVar2 = (this->dmap).m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((long)*(pointer *)
             ((long)&(peVar2->m_pmap).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
      *(long *)&(peVar2->m_pmap).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl == lVar8) {
    (this->dmap).m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->dmap).m_ref.
                super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(update_dmap->m_ref).
                super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pSVar7 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar4 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar4 != pSVar7 && -1 < (long)pSVar4 - (long)pSVar7) {
    lVar9 = 0xa0;
    lVar6 = 0;
    do {
      plVar3 = *(long **)((long)(&(pSVar7->domain).smallend + -2) + lVar9);
      if (plVar3[1] - *plVar3 == lVar8) {
        *(element_type **)((long)(&(pSVar7->domain).smallend + -2) + lVar9) =
             (update_dmap->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)(pSVar7->domain).smallend.vect + lVar9 + -0x10),
                   &(update_dmap->m_ref).
                    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        pSVar7 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar4 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lVar6 = lVar6 + 1;
      lVar5 = ((long)pSVar4 - (long)pSVar7 >> 5) * 0x6db6db6db6db6db7;
      lVar9 = lVar9 + 0xe0;
    } while (lVar5 - lVar6 != 0 && lVar6 <= lVar5);
  }
  return;
}

Assistant:

void
AmrLevel::UpdateDistributionMaps ( DistributionMapping& update_dmap )
{
    Long mapsize = update_dmap.size();

    if (dmap.size() == mapsize)
    { dmap = update_dmap; }

    for (int i = 0; i < state.size(); ++i)
    {
       if (state[i].DistributionMap().size() == mapsize)
          { state[i].setDistributionMap(update_dmap); }
    }
}